

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serializer.cpp
# Opt level: O0

void __thiscall Serializer_Operator2_Test::TestBody(Serializer_Operator2_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_e0;
  Message local_d8;
  ByteData local_d0;
  string local_b8;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  string local_80;
  ByteData256 local_60;
  undefined1 local_38 [8];
  Serializer builder;
  Serializer_Operator2_Test *this_local;
  
  builder._32_8_ = this;
  cfd::core::Serializer::Serializer((Serializer *)local_38);
  cfd::core::Serializer::operator<<((Serializer *)local_38,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"00020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
             (allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::ByteData256::ByteData256(&local_60,&local_80);
  cfd::core::Serializer::operator<<((Serializer *)local_38,&local_60);
  cfd::core::ByteData256::~ByteData256(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::Serializer::Output(&local_d0,(Serializer *)local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b8,&local_d0);
  testing::internal::EqHelper<false>::Compare<char[81],std::__cxx11::string>
            ((EqHelper<false> *)local_98,
             "\"020000000000000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4\"",
             "builder.Output().GetHex()",
             (char (*) [81])
             "020000000000000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
             &local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  cfd::core::ByteData::~ByteData(&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_serializer.cpp"
               ,0x33,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  cfd::core::Serializer::~Serializer((Serializer *)local_38);
  return;
}

Assistant:

TEST(Serializer, Operator2) {
  Serializer builder;
  builder << int64_t{2};
  builder << ByteData256("00020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4");

  EXPECT_EQ("020000000000000000020000000000000003feffff010002f1f209fee4e3e2e1d1d2d3d4c1c2c3c4",
      builder.Output().GetHex());
}